

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O2

void __thiscall
OpenMD::CubicSpline::addPoints
          (CubicSpline *this,vector<double,_std::allocator<double>_> *xps,
          vector<double,_std::allocator<double>_> *yps)

{
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    pdVar1 = (xps->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(xps->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar3) break;
    std::vector<double,_std::allocator<double>_>::push_back(&this->x_,pdVar1 + uVar3);
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->y_,
               (yps->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar3);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void CubicSpline::addPoints(const std::vector<RealType>& xps,
                              const std::vector<RealType>& yps) {
    assert(xps.size() == yps.size());

    for (unsigned int i = 0; i < xps.size(); i++) {
      x_.push_back(xps[i]);
      y_.push_back(yps[i]);
    }
  }